

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::getFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  Model *this_00;
  ulong uVar1;
  iterator __position;
  long in_RAX;
  OneHotEncoder *pOVar2;
  long *plVar3;
  undefined1 *puVar4;
  int index;
  Arena *arena;
  long local_38;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = in_RAX;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pOVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::OneHotEncoder>
                       (arena);
    (this_00->Type_).onehotencoder_ = pOVar2;
  }
  pOVar2 = (this_00->Type_).onehotencoder_;
  if (pOVar2->_oneof_case_[0] == 2) {
    puVar4 = (undefined1 *)(pOVar2->CategoryType_).int64categories_;
  }
  else {
    puVar4 = Specification::_Int64Vector_default_instance_;
  }
  if (0 < (((Int64Vector *)puVar4)->vector_).current_size_) {
    index = 0;
    do {
      plVar3 = google::protobuf::RepeatedField<long>::Get(&((Int64Vector *)puVar4)->vector_,index);
      local_38 = *plVar3;
      __position._M_current =
           (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (container,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      puVar4 = Specification::_Int64Vector_default_instance_;
      if (pOVar2->_oneof_case_[0] == 2) {
        puVar4 = (undefined1 *)(pOVar2->CategoryType_).int64categories_;
      }
      index = index + 1;
    } while (index < (((Int64Vector *)puVar4)->vector_).current_size_);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getFeatureEncoding(std::vector<int64_t>& container) {
        auto *ohe = m_spec->mutable_onehotencoder();
        
        for (int i = 0; i < ohe->int64categories().vector_size(); i++) {
            container.push_back(ohe->int64categories().vector(i));
        }
        return Result();
    }